

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

void xmlRelaxNGSetValidErrors
               (xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGValidityErrorFunc err,
               xmlRelaxNGValidityWarningFunc warn,void *ctx)

{
  if (ctxt != (xmlRelaxNGValidCtxtPtr)0x0) {
    ctxt->error = err;
    ctxt->warning = warn;
    ctxt->userData = ctx;
    ctxt->serror = (xmlStructuredErrorFunc)0x0;
  }
  return;
}

Assistant:

void
xmlRelaxNGSetValidErrors(xmlRelaxNGValidCtxtPtr ctxt,
                         xmlRelaxNGValidityErrorFunc err,
                         xmlRelaxNGValidityWarningFunc warn, void *ctx)
{
    if (ctxt == NULL)
        return;
    ctxt->error = err;
    ctxt->warning = warn;
    ctxt->userData = ctx;
    ctxt->serror = NULL;
}